

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O2

TCGTemp * tcg_temp_new_internal_m68k(TCGContext_conflict2 *s,TCGType_conflict type,_Bool temp_local)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  byte bVar4;
  TCGTempSet *pTVar5;
  TCGTemp *pTVar6;
  undefined7 in_register_00000011;
  ulong uVar7;
  
  pTVar5 = s->free_temps + (int)((int)CONCAT71(in_register_00000011,temp_local) * 5 + type);
  uVar7 = 0;
  while( true ) {
    if (0x1ff < uVar7) {
      iVar1 = s->nb_temps;
      s->nb_temps = iVar1 + 1;
      s->temps[iVar1].state = 0;
      s->temps[iVar1].state_ptr = (void *)0x0;
      s->temps[iVar1].mem_offset = 0;
      s->temps[iVar1].name = (char *)0x0;
      uVar7 = 0;
      if (temp_local) {
        uVar7 = 0x4000000000;
      }
      s->temps[iVar1].val = 0;
      s->temps[iVar1].mem_base = (TCGTemp *)0x0;
      *(ulong *)(s->temps + iVar1) = uVar7 | 0x8000000000 | (ulong)((type & 0xff) * 0x1010000);
      return s->temps + iVar1;
    }
    uVar2 = pTVar5->l[0];
    if (uVar2 != 0) break;
    pTVar5 = (TCGTempSet *)(pTVar5->l + 1);
    uVar7 = uVar7 + 0x40;
  }
  lVar3 = 0;
  if (uVar2 != 0) {
    for (; (uVar2 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
    }
  }
  bVar4 = (byte)lVar3 & 0x3f;
  pTVar5->l[0] = pTVar5->l[0] & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
  pTVar6 = s->temps + uVar7 + lVar3;
  *(ulong *)pTVar6 = *(ulong *)pTVar6 | 0x8000000000;
  return pTVar6;
}

Assistant:

TCGTemp *tcg_temp_new_internal(TCGContext *s, TCGType type, bool temp_local)
{
    TCGTemp *ts;
    int idx, k;

    k = type + (temp_local ? TCG_TYPE_COUNT : 0);
    idx = find_first_bit(s->free_temps[k].l, TCG_MAX_TEMPS);
    if (idx < TCG_MAX_TEMPS) {
        /* There is already an available temp with the right type.  */
        clear_bit(idx, s->free_temps[k].l);

        ts = &s->temps[idx];
        ts->temp_allocated = 1;
        tcg_debug_assert(ts->base_type == type);
        tcg_debug_assert(ts->temp_local == temp_local);
    } else {
        ts = tcg_temp_alloc(s);
        if (TCG_TARGET_REG_BITS == 32 && type == TCG_TYPE_I64) {
            TCGTemp *ts2 = tcg_temp_alloc(s);

            ts->base_type = type;
            ts->type = TCG_TYPE_I32;
            ts->temp_allocated = 1;
            ts->temp_local = temp_local;

            tcg_debug_assert(ts2 == ts + 1);
            ts2->base_type = TCG_TYPE_I64;
            ts2->type = TCG_TYPE_I32;
            ts2->temp_allocated = 1;
            ts2->temp_local = temp_local;
        } else {
            ts->base_type = type;
            ts->type = type;
            ts->temp_allocated = 1;
            ts->temp_local = temp_local;
        }
    }

#if defined(CONFIG_DEBUG_TCG)
    s->temps_in_use++;
#endif
    return ts;
}